

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O2

void do_actual_learning_ldf<false>(cbify *data,multi_learner *base,multi_ex *ec_seq)

{
  vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_> *this;
  vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
  *this_00;
  label_t *plVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  cb_class **ppcVar4;
  pointer ppeVar5;
  example *peVar6;
  pointer pvVar7;
  pointer pvVar8;
  pointer pvVar9;
  size_t sVar10;
  action_score *paVar11;
  label_t lVar12;
  label_t lVar13;
  float *pfVar14;
  float *pfVar15;
  cb_class *pcVar16;
  wclass *pwVar17;
  multi_learner *this_01;
  cbify *data_00;
  int iVar18;
  uint uVar19;
  vw_exception *pvVar20;
  ulong uVar21;
  cbify *pcVar22;
  float fVar23;
  size_t i;
  long lVar24;
  bool bVar25;
  uint32_t chosen_action;
  vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
  *local_240;
  multi_learner *local_238;
  cbify *local_230;
  cb_class cl;
  string local_218;
  string local_1f8;
  score_iterator local_1d8;
  score_iterator local_1c8;
  stringstream __msg;
  ostream local_1a8;
  
  local_240 = &data->cs_costs;
  uVar21 = (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  if ((ulong)((long)(data->cs_costs).
                    super__Vector_base<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(data->cs_costs).
                    super__Vector_base<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) < uVar21) {
    std::vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
    ::resize(local_240,uVar21);
    uVar21 = (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3;
  }
  this = &data->cb_costs;
  local_238 = base;
  if ((ulong)((long)(data->cb_costs).
                    super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(data->cb_costs).
                    super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) < uVar21) {
    std::vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>::resize(this,uVar21)
    ;
    uVar21 = (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3;
  }
  this_00 = &data->cb_as;
  local_230 = data;
  if ((ulong)((long)(data->cb_as).
                    super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(data->cb_as).
                    super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) < uVar21) {
    std::
    vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
    ::resize(this_00,uVar21);
  }
  lVar24 = 0;
  for (uVar21 = 0; this_01 = local_238,
      ppeVar5 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start,
      uVar21 < (ulong)((long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar5 >> 3);
      uVar21 = uVar21 + 1) {
    peVar6 = ppeVar5[uVar21];
    pvVar7 = (local_240->
             super__Vector_base<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar12 = (peVar6->l).multi;
    lVar13 = *(label_t *)&(peVar6->l).cs.costs._end;
    sVar10 = (peVar6->l).cs.costs.erase_count;
    puVar2 = (undefined8 *)((long)&pvVar7->end_array + lVar24);
    *puVar2 = (peVar6->l).cs.costs.end_array;
    puVar2[1] = sVar10;
    plVar1 = (label_t *)((long)&pvVar7->_begin + lVar24);
    *plVar1 = lVar12;
    plVar1[1] = lVar13;
    v_array<CB::cb_class>::clear
              ((v_array<CB::cb_class> *)
               ((long)&((this->
                        super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>
                        )._M_impl.super__Vector_impl_data._M_start)->_begin + lVar24));
    v_array<ACTION_SCORE::action_score>::clear
              ((v_array<ACTION_SCORE::action_score> *)
               ((long)&((this_00->
                        super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
                        )._M_impl.super__Vector_impl_data._M_start)->_begin + lVar24));
    pvVar8 = (this->
             super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    plVar1 = (label_t *)((long)&pvVar8->_begin + lVar24);
    lVar12 = *plVar1;
    lVar13 = plVar1[1];
    puVar2 = (undefined8 *)((long)&pvVar8->end_array + lVar24);
    sVar10 = puVar2[1];
    (peVar6->l).cs.costs.end_array = (wclass *)*puVar2;
    (peVar6->l).cs.costs.erase_count = sVar10;
    (peVar6->l).multi = lVar12;
    *(label_t *)&(peVar6->l).cs.costs._end = lVar13;
    pvVar9 = (this_00->
             super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (undefined8 *)((long)&pvVar9->_begin + lVar24);
    pfVar14 = (float *)puVar2[1];
    puVar3 = (undefined8 *)((long)&pvVar9->end_array + lVar24);
    pfVar15 = (float *)*puVar3;
    sVar10 = puVar3[1];
    (peVar6->pred).scalars._begin = (float *)*puVar2;
    (peVar6->pred).scalars._end = pfVar14;
    (peVar6->pred).scalars.end_array = pfVar15;
    (peVar6->pred).scalars.erase_count = sVar10;
    lVar24 = lVar24 + 0x20;
  }
  LEARNER::learner<char,_std::vector<example_*,_std::allocator<example_*>_>_>::predict
            (local_238,ec_seq,0);
  data_00 = local_230;
  peVar6 = *(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  sVar10 = local_230->example_counter;
  local_230->example_counter = sVar10 + 1;
  local_1c8._p = (action_score *)(peVar6->pred).scalars._begin;
  local_1c8._vptr_score_iterator =
       (_func_int **)
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_1d8._p = (action_score *)(peVar6->pred).scalars._end;
  local_1d8._vptr_score_iterator =
       (_func_int **)
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  iVar18 = exploration::sample_after_normalizing<ACTION_SCORE::score_iterator>
                     (sVar10 + local_230->app_seed,&local_1c8,&local_1d8,&chosen_action);
  if (iVar18 == 0) {
    paVar11 = (peVar6->pred).a_s._begin;
    cl.action = paVar11[chosen_action].action + 1;
    cl.probability = paVar11[chosen_action].score;
    if (cl.action != 0) {
      cl.cost = loss_csldf(data_00,local_240,cl.action);
      v_array<CB::cb_class>::clear((v_array<CB::cb_class> *)data_00);
      v_array<CB::cb_class>::push_back((v_array<CB::cb_class> *)data_00,&cl);
      uVar19 = cl.action - 1;
      peVar6 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar19];
      pvVar8 = (data_00->cb_costs).
               super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar12 = (peVar6->l).multi;
      pcVar16 = (cb_class *)(peVar6->l).cs.costs._end;
      sVar10 = (peVar6->l).cs.costs.erase_count;
      ppcVar4 = &pvVar8[uVar19].end_array;
      *ppcVar4 = (cb_class *)(peVar6->l).cs.costs.end_array;
      ppcVar4[1] = (cb_class *)sVar10;
      pvVar8 = pvVar8 + uVar19;
      pvVar8->_begin = (cb_class *)lVar12;
      pvVar8->_end = pcVar16;
      peVar6 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar19];
      lVar12 = (label_t)(data_00->cb_label).costs._begin;
      pcVar16 = (data_00->cb_label).costs._end;
      sVar10 = (data_00->cb_label).costs.erase_count;
      (peVar6->l).cs.costs.end_array = (wclass *)(data_00->cb_label).costs.end_array;
      (peVar6->l).cs.costs.erase_count = sVar10;
      (peVar6->l).multi = lVar12;
      (peVar6->l).cs.costs._end = (wclass *)pcVar16;
      lVar24 = 0;
      LEARNER::learner<char,_std::vector<example_*,_std::allocator<example_*>_>_>::learn
                (this_01,ec_seq,0);
      for (uVar21 = 0;
          ppeVar5 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                    super__Vector_impl_data._M_start,
          uVar21 < (ulong)((long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppeVar5 >> 3);
          uVar21 = uVar21 + 1) {
        peVar6 = ppeVar5[uVar21];
        pvVar9 = (data_00->cb_as).
                 super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pfVar14 = (peVar6->pred).scalars._begin;
        pfVar15 = (peVar6->pred).scalars._end;
        sVar10 = (peVar6->pred).scalars.erase_count;
        puVar2 = (undefined8 *)((long)&pvVar9->end_array + lVar24);
        *puVar2 = (peVar6->pred).scalars.end_array;
        puVar2[1] = sVar10;
        puVar2 = (undefined8 *)((long)&pvVar9->_begin + lVar24);
        *puVar2 = pfVar14;
        puVar2[1] = pfVar15;
        bVar25 = cl.action - 1 == uVar21;
        pcVar22 = (cbify *)((long)&((data_00->cb_costs).
                                    super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_begin + lVar24);
        if (bVar25) {
          pcVar22 = data_00;
        }
        fVar23 = 0.0;
        if (bVar25) {
          fVar23 = (float)cl.action;
        }
        lVar12 = (peVar6->l).multi;
        pcVar16 = (cb_class *)(peVar6->l).cs.costs._end;
        sVar10 = (peVar6->l).cs.costs.erase_count;
        (pcVar22->cb_label).costs.end_array = (cb_class *)(peVar6->l).cs.costs.end_array;
        (pcVar22->cb_label).costs.erase_count = sVar10;
        (pcVar22->cb_label).costs._begin = (cb_class *)lVar12;
        (pcVar22->cb_label).costs._end = pcVar16;
        pvVar7 = (data_00->cs_costs).
                 super__Vector_base<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        plVar1 = (label_t *)((long)&pvVar7->_begin + lVar24);
        lVar12 = plVar1[1];
        puVar2 = (undefined8 *)((long)&pvVar7->end_array + lVar24);
        pwVar17 = (wclass *)*puVar2;
        sVar10 = puVar2[1];
        (peVar6->l).multi = *plVar1;
        *(label_t *)&(peVar6->l).cs.costs._end = lVar12;
        (peVar6->l).cs.costs.end_array = pwVar17;
        (peVar6->l).cs.costs.erase_count = sVar10;
        (peVar6->pred).scalar = fVar23;
        lVar24 = lVar24 + 0x20;
      }
      return;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
    std::operator<<(&local_1a8,"No action with non-zero probability found!");
    pvVar20 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar20,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/cbify.cc"
               ,0x11e,&local_218);
    __cxa_throw(pvVar20,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
  std::operator<<(&local_1a8,"Failed to sample from pdf");
  pvVar20 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (pvVar20,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/cbify.cc"
             ,0x117,&local_1f8);
  __cxa_throw(pvVar20,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

void do_actual_learning_ldf(cbify& data, multi_learner& base, multi_ex& ec_seq)
{
  // change label and pred data for cb
  if (data.cs_costs.size() < ec_seq.size())
    data.cs_costs.resize(ec_seq.size());
  if (data.cb_costs.size() < ec_seq.size())
    data.cb_costs.resize(ec_seq.size());
  if (data.cb_as.size() < ec_seq.size())
    data.cb_as.resize(ec_seq.size());
  for (size_t i = 0; i < ec_seq.size(); ++i)
  {
    auto& ec = *ec_seq[i];
    data.cs_costs[i] = ec.l.cs.costs;
    data.cb_costs[i].clear();
    data.cb_as[i].clear();
    ec.l.cb.costs = data.cb_costs[i];
    ec.pred.a_s = data.cb_as[i];
  }

  base.predict(ec_seq);

  auto& out_ec = *ec_seq[0];

  uint32_t chosen_action;
  if (sample_after_normalizing(data.app_seed + data.example_counter++, begin_scores(out_ec.pred.a_s), end_scores(out_ec.pred.a_s), chosen_action))
    THROW("Failed to sample from pdf");

  CB::cb_class cl;
  cl.action = out_ec.pred.a_s[chosen_action].action + 1;
  cl.probability = out_ec.pred.a_s[chosen_action].score;

  if(!cl.action)
    THROW("No action with non-zero probability found!");

  cl.cost = loss_csldf(data, data.cs_costs, cl.action);

  // add cb label to chosen action
  data.cb_label.costs.clear();
  data.cb_label.costs.push_back(cl);
  data.cb_costs[cl.action-1] = ec_seq[cl.action-1]->l.cb.costs;
  ec_seq[cl.action - 1]->l.cb = data.cb_label;

  base.learn(ec_seq);

  // set cs prediction and reset cs costs
  for (size_t i = 0; i < ec_seq.size(); ++i)
  {
    auto& ec = *ec_seq[i];
    data.cb_as[i]=ec.pred.a_s;//store action_score vector for later reuse.
    if (i == cl.action -1 )
      data.cb_label = ec.l.cb;
    else
      data.cb_costs[i] = ec.l.cb.costs;
    ec.l.cs.costs = data.cs_costs[i];
    if (i == cl.action - 1)
      ec.pred.multiclass = cl.action;
    else
      ec.pred.multiclass = 0;
  }
}